

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_quality(REF_GRID ref_grid)

{
  uint uVar1;
  REF_HISTOGRAM in_RAX;
  undefined8 uVar2;
  char *pcVar3;
  REF_HISTOGRAM ref_histogram;
  REF_HISTOGRAM local_28;
  
  local_28 = in_RAX;
  uVar1 = ref_histogram_create(&local_28);
  if (uVar1 == 0) {
    uVar1 = ref_histogram_add_quality(local_28,ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x200,"ref_histogram_quality",(ulong)uVar1,"add quality");
      return uVar1;
    }
    if (ref_grid->mpi->id == 0) {
      ref_histogram_print(local_28,ref_grid,"quality");
    }
    uVar1 = ref_histogram_free(local_28);
    if (uVar1 == 0) {
      return 0;
    }
    pcVar3 = "free gram";
    uVar2 = 0x205;
  }
  else {
    pcVar3 = "create";
    uVar2 = 0x1fe;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar2
         ,"ref_histogram_quality",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_quality(REF_GRID ref_grid) {
  REF_HISTOGRAM ref_histogram;

  RSS(ref_histogram_create(&ref_histogram), "create");

  RSS(ref_histogram_add_quality(ref_histogram, ref_grid), "add quality");

  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_print(ref_histogram, ref_grid, "quality"), "print");

  RSS(ref_histogram_free(ref_histogram), "free gram");
  return REF_SUCCESS;
}